

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piece_picker.cpp
# Opt level: O0

int __thiscall
libtorrent::aux::piece_picker::blocks_in_piece(piece_picker *this,piece_index_t index)

{
  bool bVar1;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_24;
  int local_20;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_1c;
  piece_picker *local_18;
  piece_picker *this_local;
  piece_index_t index_local;
  
  local_20 = index.m_val;
  local_18 = this;
  this_local._0_4_ = index.m_val;
  local_1c = next<int,libtorrent::aux::piece_index_tag>(index.m_val);
  local_24 = container_wrapper<libtorrent::aux::piece_picker::piece_pos,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>_>
             ::end_index(&this->m_piece_map);
  bVar1 = strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator==
                    (&local_1c,&local_24);
  if (bVar1) {
    this_local._4_4_ = (uint)this->m_blocks_in_last_piece;
  }
  else {
    this_local._4_4_ = blocks_per_piece(this);
  }
  return this_local._4_4_;
}

Assistant:

int piece_picker::blocks_in_piece(piece_index_t const index) const
	{
		TORRENT_ASSERT(index >= piece_index_t(0));
		TORRENT_ASSERT(index < m_piece_map.end_index());
		if (next(index) == m_piece_map.end_index())
			return m_blocks_in_last_piece;
		else
			return blocks_per_piece();
	}